

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_genparams.hpp
# Opt level: O0

void __thiscall
iutest::detail::iuParamGenerator<char>::iuParamGenerator
          (iuParamGenerator<char> *this,iuParamGenerator<char> *param_1)

{
  iuParamGenerator<char> *param_1_local;
  iuParamGenerator<char> *this_local;
  
  iuIParamGenerator<char>::iuIParamGenerator
            (&this->super_iuIParamGenerator<char>,&param_1->super_iuIParamGenerator<char>);
  (this->super_iuIParamGenerator<char>)._vptr_iuIParamGenerator =
       (_func_int **)&PTR__iuParamGenerator_002bf0a0;
  this->m_pInterface = param_1->m_pInterface;
  return;
}

Assistant:

class iuParamGenerator IUTEST_CXX_FINAL : public iuIParamGenerator<T>
{
    typedef iuIParamGenerator<T> _Interface;
    typedef iuParamGenerator<T>  _Myt;
public:
    typedef T type;
public:
    iuParamGenerator(_Interface* pInterface=NULL) : m_pInterface(pInterface) {} // NOLINT

public:
    operator iuIParamGenerator<T>* () const { return m_pInterface; }

public:
#if IUTEST_HAS_CONCAT
    template<typename Other>
    iuConcatParamHolder<_Myt, Other> operator + (const Other& g) const
    {
        return iuConcatParamHolder<_Myt, Other>(*this, g);
    }
#endif

public:
    virtual void    Begin() IUTEST_CXX_OVERRIDE { m_pInterface->Begin(); }